

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.h
# Opt level: O1

void __thiscall
wallet::CKeyMetadata::SerializationOps<DataStream,wallet::CKeyMetadata,ActionUnserialize>
          (CKeyMetadata *this,DataStream *obj,undefined8 param_3,long *param_4)

{
  long in_FS_OFFSET;
  uint8_t obj_1;
  VectorFormatter<DefaultFormatter> local_22;
  char local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  ActionUnserialize::SerReadWriteMany<DataStream,int&,long&>
            ((ActionUnserialize *)obj,(DataStream *)this,(int *)&this->nCreateTime,param_4);
  if (9 < this->nVersion) {
    Unserialize<DataStream,char>(obj,&this->hdKeypath);
    DataStream::read(obj,(int)this + 0x30,(void *)0x14,(size_t)param_4);
  }
  if (0xb < this->nVersion) {
    DataStream::read(obj,(int)this + 0x48,(void *)0x4,(size_t)param_4);
    VectorFormatter<DefaultFormatter>::
    Unser<DataStream,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              (&local_22,obj,&(this->key_origin).path);
    DataStream::read(obj,(int)&local_21,(void *)0x1,(size_t)param_4);
    this->has_key_origin = local_21 != '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CKeyMetadata, obj)
    {
        READWRITE(obj.nVersion, obj.nCreateTime);
        if (obj.nVersion >= VERSION_WITH_HDDATA) {
            READWRITE(obj.hdKeypath, obj.hd_seed_id);
        }
        if (obj.nVersion >= VERSION_WITH_KEY_ORIGIN)
        {
            READWRITE(obj.key_origin);
            READWRITE(obj.has_key_origin);
        }
    }